

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O3

string * duckdb::AttachedDatabase::ExtractDatabaseName
                   (string *__return_storage_ptr__,string *dbpath,FileSystem *fs)

{
  bool bVar1;
  int iVar2;
  
  if ((dbpath->_M_string_length != 0) &&
     (iVar2 = ::std::__cxx11::string::compare((char *)dbpath), iVar2 != 0)) {
    FileSystem::ExtractBaseName((string *)__return_storage_ptr__,fs,(string *)dbpath);
    bVar1 = NameIsReserved(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"memory","");
  return __return_storage_ptr__;
}

Assistant:

string AttachedDatabase::ExtractDatabaseName(const string &dbpath, FileSystem &fs) {
	if (dbpath.empty() || dbpath == IN_MEMORY_PATH) {
		return "memory";
	}
	auto name = fs.ExtractBaseName(dbpath);
	if (NameIsReserved(name)) {
		name += "_db";
	}
	return name;
}